

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_HKDF.c
# Opt level: O0

void EverCrypt_HKDF_expand
               (Spec_Hash_Definitions_hash_alg a,uint8_t *okm,uint8_t *prk,uint32_t prklen,
               uint8_t *info,uint32_t infolen,uint32_t len)

{
  uint32_t infolen_local;
  uint8_t *info_local;
  uint32_t prklen_local;
  uint8_t *prk_local;
  uint8_t *okm_local;
  Spec_Hash_Definitions_hash_alg a_local;
  
  switch(a) {
  case '\x01':
    expand_sha2_256(okm,prk,prklen,info,infolen,len);
    break;
  case '\x02':
    expand_sha2_384(okm,prk,prklen,info,infolen,len);
    break;
  case '\x03':
    expand_sha2_512(okm,prk,prklen,info,infolen,len);
    break;
  case '\x04':
    expand_sha1(okm,prk,prklen,info,infolen,len);
    break;
  default:
    fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_HKDF.c"
            ,0x1a0);
    exit(0xfd);
  case '\x06':
    expand_blake2s(okm,prk,prklen,info,infolen,len);
    break;
  case '\a':
    expand_blake2b(okm,prk,prklen,info,infolen,len);
  }
  return;
}

Assistant:

void
EverCrypt_HKDF_expand(
  Spec_Hash_Definitions_hash_alg a,
  uint8_t *okm,
  uint8_t *prk,
  uint32_t prklen,
  uint8_t *info,
  uint32_t infolen,
  uint32_t len
)
{
  switch (a)
  {
    case Spec_Hash_Definitions_SHA1:
      {
        expand_sha1(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        expand_sha2_256(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        expand_sha2_384(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        expand_sha2_512(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_Blake2S:
      {
        expand_blake2s(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_Blake2B:
      {
        expand_blake2b(okm, prk, prklen, info, infolen, len);
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}